

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialogPrivate::showHeader(QFileDialogPrivate *this,QAction *action)

{
  byte bVar1;
  QObject *object;
  QHeaderView *this_00;
  qsizetype qVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<QAction_*> local_50;
  QAction *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = action;
  object = (QObject *)QObject::sender();
  QtPrivate::qobject_cast_helper<QActionGroup*,QObject>(object);
  this_00 = QTreeView::header(&((this->qFileDialogUi).d)->treeView->super_QTreeView);
  QActionGroup::actions();
  qVar2 = QtPrivate::indexOf<QAction*,QAction*>((QList<QAction_*> *)&local_50,&local_38,0);
  bVar1 = QAction::isChecked();
  QHeaderView::setSectionHidden(this_00,(int)qVar2 + 1,(bool)(bVar1 ^ 1));
  QArrayDataPointer<QAction_*>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::showHeader(QAction *action)
{
    Q_Q(QFileDialog);
    QActionGroup *actionGroup = qobject_cast<QActionGroup*>(q->sender());
    qFileDialogUi->treeView->header()->setSectionHidden(int(actionGroup->actions().indexOf(action) + 1),
                                                        !action->isChecked());
}